

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O3

void __thiscall HashUtil_Sha512ByteScript_Test::TestBody(HashUtil_Sha512ByteScript_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  ByteData byte_data;
  Script target;
  AssertHelper AStack_98;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [16];
  internal local_70 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined1 local_60 [80];
  
  local_90[0].ptr_ = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,
             "21026dccc749adc2a9d0d89497ac511f760f45c47dc5ed9cf352a58ac706453880aeadab210255a9626aebf5e29c0e6538428ba0d1dcf6ca98ffdf086aa8ced5e0d0215ea465ac"
             ,"");
  cfd::core::Script::Script((Script *)(local_60 + 0x18),(string *)local_90);
  if (local_90[0].ptr_ != local_80) {
    operator_delete(local_90[0].ptr_);
  }
  cfd::core::HashUtil::Sha512((Script *)local_60);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_70,"byte_data.GetHex().c_str()",
             "\"7ad6132c2611fd0496ad42c758edc1bc2a23c3a4c463e139e144e25c35a53765c4c4c99d68d821a1bdd71b10e88afebdba72bfa0ae3877f628f1e2eab5320229\""
             ,(char *)local_90[0].ptr_,
             "7ad6132c2611fd0496ad42c758edc1bc2a23c3a4c463e139e144e25c35a53765c4c4c99d68d821a1bdd71b10e88afebdba72bfa0ae3877f628f1e2eab5320229"
            );
  if (local_90[0].ptr_ != local_80) {
    operator_delete(local_90[0].ptr_);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_90);
    if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_hashutil.cpp"
               ,0x150,message);
    testing::internal::AssertHelper::operator=(&AStack_98,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper(&AStack_98);
    if (local_90[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_90[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_90[0].ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((_func_int **)local_60._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_60._0_8_);
  }
  cfd::core::Script::~Script((Script *)(local_60 + 0x18));
  return;
}

Assistant:

TEST(HashUtil, Sha256BytePubkey) {
  Pubkey target(
      "032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db");
  ByteData256 byte_data = HashUtil::Sha256(target);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "2213d0c45bf1ece1a9b0c2d5a21d603601e88e22ae2786fe3f0060ee4aad321d");
}